

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * sqlite3ValueText(sqlite3_value *pVal,u8 enc)

{
  uint uVar1;
  void *pvVar2;
  
  if (pVal != (sqlite3_value *)0x0) {
    uVar1._0_2_ = pVal->flags;
    uVar1._2_1_ = pVal->enc;
    uVar1._3_1_ = pVal->eSubtype;
    if (((~uVar1 & 0x202) == 0) && (pVal->enc == enc)) {
      return pVal->z;
    }
    if ((uVar1 & 1) == 0) {
      pvVar2 = valueToText(pVal,enc);
      return pvVar2;
    }
  }
  return (void *)0x0;
}

Assistant:

SQLITE_PRIVATE const void *sqlite3ValueText(sqlite3_value* pVal, u8 enc){
  if( !pVal ) return 0;
  assert( pVal->db==0 || sqlite3_mutex_held(pVal->db->mutex) );
  assert( (enc&3)==(enc&~SQLITE_UTF16_ALIGNED) );
  assert( (pVal->flags & MEM_RowSet)==0 );
  if( (pVal->flags&(MEM_Str|MEM_Term))==(MEM_Str|MEM_Term) && pVal->enc==enc ){
    return pVal->z;
  }
  if( pVal->flags&MEM_Null ){
    return 0;
  }
  return valueToText(pVal, enc);
}